

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::BlobProto::BlobProto(BlobProto *this,BlobProto *from)

{
  void *pvVar1;
  int32 iVar2;
  int32 iVar3;
  int32 iVar4;
  BlobShape *this_00;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__BlobProto_0075f460
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  google::protobuf::RepeatedField<float>::RepeatedField(&this->data_,&from->data_);
  google::protobuf::RepeatedField<float>::RepeatedField(&this->diff_,&from->diff_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->double_data_,&from->double_data_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->double_diff_,&from->double_diff_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (((from->_has_bits_).has_bits_[0] & 1) == 0) {
    this_00 = (BlobShape *)0x0;
  }
  else {
    this_00 = (BlobShape *)operator_new(0x30);
    BlobShape::BlobShape(this_00,from->shape_);
  }
  this->shape_ = this_00;
  iVar2 = from->channels_;
  iVar3 = from->height_;
  iVar4 = from->width_;
  this->num_ = from->num_;
  this->channels_ = iVar2;
  this->height_ = iVar3;
  this->width_ = iVar4;
  return;
}

Assistant:

BlobProto::BlobProto(const BlobProto& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      data_(from.data_),
      diff_(from.diff_),
      double_data_(from.double_data_),
      double_diff_(from.double_diff_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_shape()) {
    shape_ = new ::caffe::BlobShape(*from.shape_);
  } else {
    shape_ = NULL;
  }
  ::memcpy(&num_, &from.num_,
    reinterpret_cast<char*>(&width_) -
    reinterpret_cast<char*>(&num_) + sizeof(width_));
  // @@protoc_insertion_point(copy_constructor:caffe.BlobProto)
}